

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall
lsh::vector::vector(vector *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *cs,uint s)

{
  size_type sVar1;
  const_reference __x;
  uint local_30;
  uint i;
  uint n;
  uint s_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cs_local;
  vector *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->components_);
  this->size_ = s;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(cs);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->components_,sVar1 & 0xffffffff);
  for (local_30 = 0; local_30 < (uint)sVar1; local_30 = local_30 + 1) {
    __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](cs,(ulong)local_30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->components_,__x);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::shrink_to_fit(&this->components_);
  return;
}

Assistant:

vector::vector(const std::vector<unsigned int>& cs, unsigned int s) {
    this->size_ = s;

    unsigned int n = cs.size();

    this->components_.reserve(n);

    for (unsigned int i = 0; i < n; i++) {
      this->components_.push_back(cs[i]);
    }

    this->components_.shrink_to_fit();
  }